

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# E.h
# Opt level: O1

void __thiscall E::Print(E *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)(this + 8),*(long *)(this + 0x10));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Print() const 
        { std::cout << "ERROR: "<< _m_error << std::endl;}